

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateClipOrCullDistanceAtReference
          (BuiltInsValidator *this,Decoration *decoration,Instruction *built_in_inst,
          Instruction *referenced_inst,Instruction *referenced_from_inst)

{
  Instruction *pIVar1;
  Instruction *pIVar2;
  bool bVar3;
  BuiltIn BVar4;
  int iVar5;
  spv_result_t sVar6;
  spv_const_context psVar7;
  DiagnosticStream *pDVar8;
  AssemblyGrammar *pAVar9;
  map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
  *this_00;
  reference pEVar10;
  mapped_type *pmVar11;
  BuiltInsValidator *local_dd0;
  code *local_dc8;
  undefined8 local_dc0;
  type local_db8;
  value_type local_c68;
  uint32_t local_c44;
  string local_c40;
  char *local_c20;
  string local_c18;
  DiagnosticStream local_bf8;
  uint32_t local_a1c;
  undefined1 auStack_a18 [4];
  uint32_t vuid_3;
  Instruction *local_a10;
  Instruction *local_a08;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_a00;
  undefined4 local_9dc;
  undefined1 auStack_9d8 [4];
  spv_result_t error_2;
  Instruction *local_9d0;
  Instruction *local_9c8;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_9c0;
  undefined4 local_99c;
  undefined1 auStack_998 [4];
  spv_result_t error_1;
  Instruction *local_990;
  Instruction *local_988;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_980;
  undefined4 local_960;
  ExecutionModel local_95c;
  spv_result_t error;
  ExecutionModel execution_model;
  iterator __end3;
  iterator __begin3;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *__range3;
  BuiltInsValidator *local_938;
  code *local_930;
  undefined8 local_928;
  type local_920;
  value_type local_7b8;
  uint32_t local_794;
  uint local_790;
  ExecutionModel local_78c;
  uint32_t vuid_2;
  code *local_780;
  undefined8 local_778;
  type local_770;
  value_type local_608;
  uint32_t local_5e8;
  ExecutionModel local_5e4;
  BuiltInsValidator *local_5e0;
  code *local_5d8;
  undefined8 local_5d0;
  type local_5c8;
  function<spv_result_t_(const_spvtools::val::Instruction_&)> local_460;
  uint32_t local_440;
  ExecutionModel local_43c;
  BuiltInsValidator *local_438;
  code *local_430;
  undefined8 local_428;
  type local_420;
  function<spv_result_t_(const_spvtools::val::Instruction_&)> local_2b8;
  uint32_t local_298;
  uint local_294;
  undefined1 local_290 [4];
  uint32_t vuid_1;
  string local_270;
  char *local_250;
  string local_248;
  DiagnosticStream local_228;
  uint32_t local_4c;
  StorageClass local_48;
  uint32_t vuid;
  StorageClass storage_class;
  uint32_t operand;
  Instruction *referenced_from_inst_local;
  Instruction *referenced_inst_local;
  Instruction *built_in_inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  _storage_class = referenced_from_inst;
  referenced_from_inst_local = referenced_inst;
  referenced_inst_local = built_in_inst;
  built_in_inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  vuid = Decoration::builtin(decoration);
  psVar7 = ValidationState_t::context(this->_);
  bVar3 = spvIsVulkanEnv(psVar7->target_env);
  if (bVar3) {
    local_48 = GetStorageClass(_storage_class);
    if (((local_48 != Max) && (local_48 != Input)) && (local_48 != Output)) {
      BVar4 = Decoration::builtin((Decoration *)built_in_inst_local);
      local_4c = 0x1067;
      if (BVar4 == ClipDistance) {
        local_4c = 0x105e;
      }
      ValidationState_t::diag(&local_228,this->_,SPV_ERROR_INVALID_DATA,_storage_class);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_248,this->_,local_4c,(char *)0x0);
      pDVar8 = DiagnosticStream::operator<<(&local_228,&local_248);
      pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [28])"Vulkan spec allows BuiltIn ");
      pAVar9 = ValidationState_t::grammar(this->_);
      local_250 = AssemblyGrammar::lookupOperandName(pAVar9,SPV_OPERAND_TYPE_BUILT_IN,vuid);
      pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_250);
      pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [68])0x620b94);
      (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                (&local_270,this,(Decoration *)built_in_inst_local,referenced_inst_local,
                 referenced_from_inst_local,_storage_class,Max);
      pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_270);
      pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [2])0x634f49);
      (anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
                ((string *)local_290,this,_storage_class);
      pDVar8 = DiagnosticStream::operator<<
                         (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_290);
      this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      std::__cxx11::string::~string((string *)local_290);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_248);
      DiagnosticStream::~DiagnosticStream(&local_228);
      return this_local._4_4_;
    }
    if (local_48 == Input) {
      if (this->function_id_ != 0) {
        __assert_fail("function_id_ == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp"
                      ,0x4cc,
                      "spv_result_t spvtools::val::(anonymous namespace)::BuiltInsValidator::ValidateClipOrCullDistanceAtReference(const Decoration &, const Instruction &, const Instruction &, const Instruction &)"
                     );
      }
      BVar4 = Decoration::builtin((Decoration *)built_in_inst_local);
      local_294 = (uint)(BVar4 != ClipDistance) * 9 + 0x105c;
      this_00 = &this->id_to_at_reference_checks_;
      local_298 = Instruction::id(_storage_class);
      pmVar11 = std::
                map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
                ::operator[](this_00,&local_298);
      local_430 = ValidateNotCalledWithExecutionModel;
      local_428 = 0;
      local_43c = Vertex;
      local_438 = this;
      std::
      bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,unsigned_int&,char_const(&)[140],spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
                (&local_420,(offset_in_BuiltInsValidator_to_subr *)&local_430,&local_438,&local_294,
                 (char (*) [140])
                 "Vulkan spec doesn\'t allow BuiltIn ClipDistance/CullDistance to be used for variables with Input storage class if execution model is Vertex."
                 ,&local_43c,(Decoration *)built_in_inst_local,referenced_inst_local,_storage_class,
                 (_Placeholder<1> *)&std::placeholders::_1);
      std::function<spv_result_t(spvtools::val::Instruction_const&)>::
      function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,unsigned_int,char_const*,spv::ExecutionModel,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
                ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_2b8,&local_420)
      ;
      std::__cxx11::
      list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
      ::push_back(pmVar11,&local_2b8);
      std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_2b8);
      std::
      _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_unsigned_int,_const_char_*,_spv::ExecutionModel,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(int,_const_char_*,_spv::ExecutionModel,_const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
      ::~_Bind(&local_420);
      local_440 = Instruction::id(_storage_class);
      pmVar11 = std::
                map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
                ::operator[](this_00,&local_440);
      local_5d8 = ValidateNotCalledWithExecutionModel;
      local_5d0 = 0;
      local_5e4 = MeshNV;
      local_5e0 = this;
      std::
      bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,unsigned_int&,char_const(&)[140],spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
                (&local_5c8,(offset_in_BuiltInsValidator_to_subr *)&local_5d8,&local_5e0,&local_294,
                 (char (*) [140])
                 "Vulkan spec doesn\'t allow BuiltIn ClipDistance/CullDistance to be used for variables with Input storage class if execution model is MeshNV."
                 ,&local_5e4,(Decoration *)built_in_inst_local,referenced_inst_local,_storage_class,
                 (_Placeholder<1> *)&std::placeholders::_1);
      std::function<spv_result_t(spvtools::val::Instruction_const&)>::
      function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,unsigned_int,char_const*,spv::ExecutionModel,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
                ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_460,&local_5c8)
      ;
      std::__cxx11::
      list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
      ::push_back(pmVar11,&local_460);
      std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_460);
      std::
      _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_unsigned_int,_const_char_*,_spv::ExecutionModel,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(int,_const_char_*,_spv::ExecutionModel,_const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
      ::~_Bind(&local_5c8);
      local_5e8 = Instruction::id(_storage_class);
      pmVar11 = std::
                map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
                ::operator[](this_00,&local_5e8);
      local_780 = ValidateNotCalledWithExecutionModel;
      local_778 = 0;
      local_78c = MeshEXT;
      _vuid_2 = this;
      std::
      bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,unsigned_int&,char_const(&)[141],spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
                (&local_770,(offset_in_BuiltInsValidator_to_subr *)&local_780,
                 (BuiltInsValidator **)&vuid_2,&local_294,
                 (char (*) [141])
                 "Vulkan spec doesn\'t allow BuiltIn ClipDistance/CullDistance to be used for variables with Input storage class if execution model is MeshEXT."
                 ,&local_78c,(Decoration *)built_in_inst_local,referenced_inst_local,_storage_class,
                 (_Placeholder<1> *)&std::placeholders::_1);
      std::function<spv_result_t(spvtools::val::Instruction_const&)>::
      function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,unsigned_int,char_const*,spv::ExecutionModel,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
                ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_608,&local_770)
      ;
      std::__cxx11::
      list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
      ::push_back(pmVar11,&local_608);
      std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_608);
      std::
      _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_unsigned_int,_const_char_*,_spv::ExecutionModel,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(int,_const_char_*,_spv::ExecutionModel,_const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
      ::~_Bind(&local_770);
    }
    if (local_48 == Output) {
      if (this->function_id_ != 0) {
        __assert_fail("function_id_ == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp"
                      ,0x4e7,
                      "spv_result_t spvtools::val::(anonymous namespace)::BuiltInsValidator::ValidateClipOrCullDistanceAtReference(const Decoration &, const Instruction &, const Instruction &, const Instruction &)"
                     );
      }
      BVar4 = Decoration::builtin((Decoration *)built_in_inst_local);
      local_790 = (uint)(BVar4 != ClipDistance) * 9 + 0x105d;
      local_794 = Instruction::id(_storage_class);
      pmVar11 = std::
                map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
                ::operator[](&this->id_to_at_reference_checks_,&local_794);
      local_930 = ValidateNotCalledWithExecutionModel;
      local_928 = 0;
      __range3._4_4_ = 4;
      local_938 = this;
      std::
      bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,unsigned_int&,char_const(&)[143],spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
                (&local_920,(offset_in_BuiltInsValidator_to_subr *)&local_930,&local_938,&local_790,
                 (char (*) [143])
                 "Vulkan spec doesn\'t allow BuiltIn ClipDistance/CullDistance to be used for variables with Output storage class if execution model is Fragment."
                 ,(ExecutionModel *)((long)&__range3 + 4),(Decoration *)built_in_inst_local,
                 referenced_inst_local,_storage_class,(_Placeholder<1> *)&std::placeholders::_1);
      std::function<spv_result_t(spvtools::val::Instruction_const&)>::
      function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,unsigned_int,char_const*,spv::ExecutionModel,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
                ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_7b8,&local_920)
      ;
      std::__cxx11::
      list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
      ::push_back(pmVar11,&local_7b8);
      std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_7b8);
      std::
      _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_unsigned_int,_const_char_*,_spv::ExecutionModel,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(int,_const_char_*,_spv::ExecutionModel,_const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
      ::~_Bind(&local_920);
    }
    __end3 = std::
             set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
             ::begin(&this->execution_models_);
    _error = std::
             set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
             ::end(&this->execution_models_);
    while (bVar3 = std::operator!=(&__end3,(_Self *)&error), bVar3) {
      pEVar10 = std::_Rb_tree_const_iterator<spv::ExecutionModel>::operator*(&__end3);
      pIVar2 = built_in_inst_local;
      pIVar1 = referenced_inst_local;
      local_95c = *pEVar10;
      if (local_95c == Vertex) {
LAB_004ec9d3:
        local_990 = built_in_inst_local;
        local_988 = _storage_class;
        _auStack_998 = this;
        std::function<spv_result_t(std::__cxx11::string_const&)>::
        function<spvtools::val::(anonymous_namespace)::BuiltInsValidator::ValidateClipOrCullDistanceAtReference(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)::__0,void>
                  ((function<spv_result_t(std::__cxx11::string_const&)> *)&local_980,
                   (anon_class_24_3_b9c58bca *)auStack_998);
        sVar6 = ValidateF32Arr(this,(Decoration *)pIVar2,pIVar1,0,&local_980);
        std::
        function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::~function(&local_980);
        if (sVar6 != SPV_SUCCESS) {
          return sVar6;
        }
        local_960 = 0;
      }
      else {
        if (2 < local_95c - TessellationControl) {
          if (local_95c == Fragment) goto LAB_004ec9d3;
          if ((local_95c != MeshNV) && (local_95c != MeshEXT)) {
            BVar4 = Decoration::builtin((Decoration *)built_in_inst_local);
            local_a1c = 0x1064;
            if (BVar4 == ClipDistance) {
              local_a1c = 0x105b;
            }
            ValidationState_t::diag(&local_bf8,this->_,SPV_ERROR_INVALID_DATA,_storage_class);
            ValidationState_t::VkErrorID_abi_cxx11_(&local_c18,this->_,local_a1c,(char *)0x0);
            pDVar8 = DiagnosticStream::operator<<(&local_bf8,&local_c18);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(char (*) [28])"Vulkan spec allows BuiltIn ");
            pAVar9 = ValidationState_t::grammar(this->_);
            local_c20 = AssemblyGrammar::lookupOperandName(pAVar9,SPV_OPERAND_TYPE_BUILT_IN,vuid);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_c20);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(char (*) [115])
                                       " to be used only with Fragment, Vertex, TessellationControl, TessellationEvaluation or Geometry execution models. "
                               );
            (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                      (&local_c40,this,(Decoration *)built_in_inst_local,referenced_inst_local,
                       referenced_from_inst_local,_storage_class,local_95c);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_c40);
            this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
            std::__cxx11::string::~string((string *)&local_c40);
            std::__cxx11::string::~string((string *)&local_c18);
            DiagnosticStream::~DiagnosticStream(&local_bf8);
            return this_local._4_4_;
          }
        }
        iVar5 = Decoration::struct_member_index((Decoration *)built_in_inst_local);
        pIVar2 = built_in_inst_local;
        pIVar1 = referenced_inst_local;
        if (iVar5 == -1) {
          local_a10 = built_in_inst_local;
          local_a08 = _storage_class;
          _auStack_a18 = this;
          std::function<spv_result_t(std::__cxx11::string_const&)>::
          function<spvtools::val::(anonymous_namespace)::BuiltInsValidator::ValidateClipOrCullDistanceAtReference(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)::__2,void>
                    ((function<spv_result_t(std::__cxx11::string_const&)> *)&local_a00,
                     (anon_class_24_3_b9c58bca *)auStack_a18);
          sVar6 = ValidateOptionalArrayedF32Arr(this,(Decoration *)pIVar2,pIVar1,0,&local_a00);
          std::
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~function(&local_a00);
          if (sVar6 != SPV_SUCCESS) {
            return sVar6;
          }
          local_9dc = 0;
        }
        else {
          local_9d0 = built_in_inst_local;
          local_9c8 = _storage_class;
          _auStack_9d8 = this;
          std::function<spv_result_t(std::__cxx11::string_const&)>::
          function<spvtools::val::(anonymous_namespace)::BuiltInsValidator::ValidateClipOrCullDistanceAtReference(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)::__1,void>
                    ((function<spv_result_t(std::__cxx11::string_const&)> *)&local_9c0,
                     (anon_class_24_3_b9c58bca *)auStack_9d8);
          sVar6 = ValidateF32Arr(this,(Decoration *)pIVar2,pIVar1,0,&local_9c0);
          std::
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~function(&local_9c0);
          if (sVar6 != SPV_SUCCESS) {
            return sVar6;
          }
          local_99c = 0;
        }
      }
      std::_Rb_tree_const_iterator<spv::ExecutionModel>::operator++(&__end3);
    }
  }
  if (this->function_id_ == 0) {
    local_c44 = Instruction::id(_storage_class);
    pmVar11 = std::
              map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
              ::operator[](&this->id_to_at_reference_checks_,&local_c44);
    local_dc8 = ValidateClipOrCullDistanceAtReference;
    local_dc0 = 0;
    local_dd0 = this;
    std::
    bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
              (&local_db8,(offset_in_BuiltInsValidator_to_subr *)&local_dc8,&local_dd0,
               (Decoration *)built_in_inst_local,referenced_inst_local,_storage_class,
               (_Placeholder<1> *)&std::placeholders::_1);
    std::function<spv_result_t(spvtools::val::Instruction_const&)>::
    function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
              ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_c68,&local_db8);
    std::__cxx11::
    list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
    ::push_back(pmVar11,&local_c68);
    std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_c68);
    std::
    _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
    ::~_Bind(&local_db8);
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateClipOrCullDistanceAtReference(
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst,
    const Instruction& referenced_from_inst) {
  uint32_t operand = (uint32_t)decoration.builtin();
  if (spvIsVulkanEnv(_.context()->target_env)) {
    const spv::StorageClass storage_class = GetStorageClass(referenced_from_inst);
    if (storage_class != spv::StorageClass::Max &&
        storage_class != spv::StorageClass::Input &&
        storage_class != spv::StorageClass::Output) {
      uint32_t vuid =
          (decoration.builtin() == spv::BuiltIn::ClipDistance) ? 4190 : 4199;
      return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
             << _.VkErrorID(vuid) << "Vulkan spec allows BuiltIn "
             << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN,
                                              operand)
             << " to be only used for variables with Input or Output storage "
                "class. "
             << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                 referenced_from_inst)
             << " " << GetStorageClassDesc(referenced_from_inst);
    }

    if (storage_class == spv::StorageClass::Input) {
      assert(function_id_ == 0);
      uint32_t vuid =
          (decoration.builtin() == spv::BuiltIn::ClipDistance) ? 4188 : 4197;
      id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
          &BuiltInsValidator::ValidateNotCalledWithExecutionModel, this, vuid,
          "Vulkan spec doesn't allow BuiltIn ClipDistance/CullDistance to be "
          "used for variables with Input storage class if execution model is "
          "Vertex.",
          spv::ExecutionModel::Vertex, decoration, built_in_inst,
          referenced_from_inst, std::placeholders::_1));
      id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
          &BuiltInsValidator::ValidateNotCalledWithExecutionModel, this, vuid,
          "Vulkan spec doesn't allow BuiltIn ClipDistance/CullDistance to be "
          "used for variables with Input storage class if execution model is "
          "MeshNV.",
          spv::ExecutionModel::MeshNV, decoration, built_in_inst,
          referenced_from_inst, std::placeholders::_1));
      id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
          &BuiltInsValidator::ValidateNotCalledWithExecutionModel, this, vuid,
          "Vulkan spec doesn't allow BuiltIn ClipDistance/CullDistance to be "
          "used for variables with Input storage class if execution model is "
          "MeshEXT.",
          spv::ExecutionModel::MeshEXT, decoration, built_in_inst,
          referenced_from_inst, std::placeholders::_1));
    }

    if (storage_class == spv::StorageClass::Output) {
      assert(function_id_ == 0);
      uint32_t vuid =
          (decoration.builtin() == spv::BuiltIn::ClipDistance) ? 4189 : 4198;
      id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
          &BuiltInsValidator::ValidateNotCalledWithExecutionModel, this, vuid,
          "Vulkan spec doesn't allow BuiltIn ClipDistance/CullDistance to be "
          "used for variables with Output storage class if execution model is "
          "Fragment.",
          spv::ExecutionModel::Fragment, decoration, built_in_inst,
          referenced_from_inst, std::placeholders::_1));
    }

    for (const spv::ExecutionModel execution_model : execution_models_) {
      switch (execution_model) {
        case spv::ExecutionModel::Fragment:
        case spv::ExecutionModel::Vertex: {
          if (spv_result_t error = ValidateF32Arr(
                  decoration, built_in_inst, /* Any number of components */ 0,
                  [this, &decoration, &referenced_from_inst](
                      const std::string& message) -> spv_result_t {
                    uint32_t vuid =
                        (decoration.builtin() == spv::BuiltIn::ClipDistance)
                            ? 4191
                            : 4200;
                    return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
                           << _.VkErrorID(vuid)
                           << "According to the Vulkan spec BuiltIn "
                           << _.grammar().lookupOperandName(
                                  SPV_OPERAND_TYPE_BUILT_IN,
                                  (uint32_t)decoration.builtin())
                           << " variable needs to be a 32-bit float array. "
                           << message;
                  })) {
            return error;
          }
          break;
        }
        case spv::ExecutionModel::TessellationControl:
        case spv::ExecutionModel::TessellationEvaluation:
        case spv::ExecutionModel::Geometry:
        case spv::ExecutionModel::MeshNV:
        case spv::ExecutionModel::MeshEXT: {
          if (decoration.struct_member_index() != Decoration::kInvalidMember) {
            // The outer level of array is applied on the variable.
            if (spv_result_t error = ValidateF32Arr(
                    decoration, built_in_inst, /* Any number of components */ 0,
                    [this, &decoration, &referenced_from_inst](
                        const std::string& message) -> spv_result_t {
                      uint32_t vuid =
                          (decoration.builtin() == spv::BuiltIn::ClipDistance)
                              ? 4191
                              : 4200;
                      return _.diag(SPV_ERROR_INVALID_DATA,
                                    &referenced_from_inst)
                             << _.VkErrorID(vuid)
                             << "According to the Vulkan spec BuiltIn "
                             << _.grammar().lookupOperandName(
                                    SPV_OPERAND_TYPE_BUILT_IN,
                                    (uint32_t)decoration.builtin())
                             << " variable needs to be a 32-bit float array. "
                             << message;
                    })) {
              return error;
            }
          } else {
            if (spv_result_t error = ValidateOptionalArrayedF32Arr(
                    decoration, built_in_inst, /* Any number of components */ 0,
                    [this, &decoration, &referenced_from_inst](
                        const std::string& message) -> spv_result_t {
                      uint32_t vuid =
                          (decoration.builtin() == spv::BuiltIn::ClipDistance)
                              ? 4191
                              : 4200;
                      return _.diag(SPV_ERROR_INVALID_DATA,
                                    &referenced_from_inst)
                             << _.VkErrorID(vuid)
                             << "According to the Vulkan spec BuiltIn "
                             << _.grammar().lookupOperandName(
                                    SPV_OPERAND_TYPE_BUILT_IN,
                                    (uint32_t)decoration.builtin())
                             << " variable needs to be a 32-bit float array. "
                             << message;
                    })) {
              return error;
            }
          }
          break;
        }

        default: {
          uint32_t vuid = (decoration.builtin() == spv::BuiltIn::ClipDistance)
                              ? 4187
                              : 4196;
          return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
                 << _.VkErrorID(vuid) << "Vulkan spec allows BuiltIn "
                 << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN,
                                                  operand)
                 << " to be used only with Fragment, Vertex, "
                    "TessellationControl, TessellationEvaluation or Geometry "
                    "execution models. "
                 << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                     referenced_from_inst, execution_model);
        }
      }
    }
  }

  if (function_id_ == 0) {
    // Propagate this rule to all dependant ids in the global scope.
    id_to_at_reference_checks_[referenced_from_inst.id()].push_back(
        std::bind(&BuiltInsValidator::ValidateClipOrCullDistanceAtReference,
                  this, decoration, built_in_inst, referenced_from_inst,
                  std::placeholders::_1));
  }

  return SPV_SUCCESS;
}